

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _treeIterator.hpp
# Opt level: O1

void __thiscall
ft::
map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_ft::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ft::allocator<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
::erase(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_ft::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ft::allocator<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
        *this,iterator *first,iterator *last)

{
  treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  *ptVar1;
  treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  *ptVar2;
  treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  *ptVar3;
  treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  *ptVar4;
  bool bVar5;
  iterator local_48;
  
  local_48.m_node = first->m_node;
  if (local_48.m_node != last->m_node) {
    do {
      local_48.m_tree = first->m_tree;
      ptVar1 = (local_48.m_node)->right;
      ptVar2 = (local_48.m_tree)->NIL;
      ptVar4 = local_48.m_node;
      if (ptVar1 == ptVar2) {
        do {
          ptVar3 = ptVar4->parent;
          bVar5 = ptVar3->right == ptVar4;
          ptVar4 = ptVar3;
        } while (bVar5);
      }
      else {
        first->m_node = ptVar1;
        do {
          ptVar3 = ptVar1;
          ptVar1 = ptVar3->left;
        } while (ptVar3->left != ptVar2);
      }
      first->m_node = ptVar3;
      local_48._vptr_treeIterator = (_func_int **)&PTR__treeIterator_00113ab0;
      erase(this,&local_48);
      local_48.m_node = first->m_node;
    } while (local_48.m_node != last->m_node);
  }
  return;
}

Assistant:

treeNode<value_type>*	node() const { return this->m_node; }